

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::java::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,java *this,FieldDescriptor *field,bool immutable,
          ClassNameResolver *name_resolver)

{
  float value;
  double value_00;
  java jVar1;
  string *src;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  Type TVar5;
  Descriptor *descriptor;
  long *plVar6;
  EnumDescriptor *descriptor_00;
  LogMessage *other;
  undefined8 *puVar7;
  EnumValueDescriptor *pEVar8;
  undefined7 in_register_00000009;
  size_type *psVar9;
  long i;
  char *pcVar10;
  java *this_00;
  char *pcVar11;
  ulong uVar12;
  bool bVar13;
  SubstituteArg *in_stack_fffffffffffffdc8;
  undefined1 local_230 [56];
  string local_1f8;
  undefined1 local_1d8 [48];
  SubstituteArg local_1a8;
  SubstituteArg local_178;
  SubstituteArg local_148;
  SubstituteArg local_118;
  SubstituteArg local_e8;
  SubstituteArg local_b8;
  SubstituteArg local_88;
  SubstituteArg local_58;
  
  this_00 = this;
  TVar5 = FieldDescriptor::type((FieldDescriptor *)this);
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar5 * 4)) {
  case 1:
  case 3:
    SimpleItoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)(ulong)*(uint *)(this + 0xa0),(int)i);
    return __return_storage_ptr__;
  case 2:
    SimpleItoa_abi_cxx11_((string *)local_230,*(protobuf **)(this + 0xa0),i);
    plVar6 = (long *)std::__cxx11::string::append((char *)local_230);
    break;
  case 4:
    SimpleItoa_abi_cxx11_((string *)local_230,*(protobuf **)(this + 0xa0),i);
    plVar6 = (long *)std::__cxx11::string::append((char *)local_230);
    break;
  case 5:
    value_00 = *(double *)(this + 0xa0);
    if (INFINITY <= value_00) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "Double.POSITIVE_INFINITY";
      pcVar10 = "";
      goto LAB_0021822c;
    }
    if (value_00 <= -INFINITY) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "Double.NEGATIVE_INFINITY";
      pcVar10 = "";
      goto LAB_0021822c;
    }
    if (NAN(value_00)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "Double.NaN";
      pcVar10 = "";
      goto LAB_0021822c;
    }
    SimpleDtoa_abi_cxx11_((string *)local_230,(protobuf *)this_00,value_00);
    std::operator+(__return_storage_ptr__,(string *)local_230,"D");
    goto LAB_002180ff;
  case 6:
    value = *(float *)(this + 0xa0);
    if (INFINITY <= value) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "Float.POSITIVE_INFINITY";
      pcVar10 = "";
      goto LAB_0021822c;
    }
    if (value <= -INFINITY) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "Float.NEGATIVE_INFINITY";
      pcVar10 = "";
      goto LAB_0021822c;
    }
    if (NAN(value)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "Float.NaN";
      pcVar10 = "";
      goto LAB_0021822c;
    }
    SimpleFtoa_abi_cxx11_((string *)local_230,(protobuf *)this_00,value);
    std::operator+(__return_storage_ptr__,(string *)local_230,"F");
    goto LAB_002180ff;
  case 7:
    jVar1 = this[0xa0];
    pcVar11 = "false";
    if ((ulong)(byte)jVar1 != 0) {
      pcVar11 = "true";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar10 = pcVar11 + ((ulong)(byte)jVar1 ^ 5);
    goto LAB_0021822c;
  case 8:
    descriptor_00 = FieldDescriptor::enum_type((FieldDescriptor *)this);
    ClassNameResolver::GetClassName_abi_cxx11_
              ((string *)local_1d8,(ClassNameResolver *)CONCAT71(in_register_00000009,immutable),
               descriptor_00,SUB81(field,0));
    plVar6 = (long *)std::__cxx11::string::append((char *)local_1d8);
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar9) {
      local_230._16_8_ = *psVar9;
      local_230._24_8_ = plVar6[3];
      local_230._0_8_ = local_230 + 0x10;
    }
    else {
      local_230._16_8_ = *psVar9;
      local_230._0_8_ = (size_type *)*plVar6;
    }
    local_230._8_8_ = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    pEVar8 = FieldDescriptor::default_value_enum((FieldDescriptor *)this);
    plVar6 = (long *)std::__cxx11::string::_M_append(local_230,**(ulong **)pEVar8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar9) {
      lVar3 = plVar6[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    }
    __return_storage_ptr__->_M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
LAB_0021849c:
      operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
    }
LAB_002184a9:
    local_1f8.field_2._M_allocated_capacity = local_1d8._16_8_;
    local_1f8._M_dataplus._M_p = (pointer)local_1d8._0_8_;
    if ((undefined1 *)local_1d8._0_8_ == local_1d8 + 0x10) {
      return __return_storage_ptr__;
    }
    goto LAB_002185a0;
  case 9:
    TVar5 = FieldDescriptor::type((FieldDescriptor *)this);
    if (TVar5 == TYPE_BYTES) {
      if (this[0x98] != (java)0x1) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar11 = "com.google.protobuf.ByteString.EMPTY";
        pcVar10 = "";
        goto LAB_0021822c;
      }
      CEscape(&local_1f8,*(string **)(this + 0xa0));
      local_230._0_8_ = local_1f8._M_dataplus._M_p;
      local_230._8_4_ = (undefined4)local_1f8._M_string_length;
      local_1d8._0_8_ = (long *)0x0;
      local_1d8._8_4_ = -1;
      local_58.text_ = (char *)0x0;
      local_58.size_ = -1;
      local_88.text_ = (char *)0x0;
      local_88.size_ = -1;
      local_b8.text_ = (char *)0x0;
      local_b8.size_ = -1;
      local_e8.text_ = (char *)0x0;
      local_e8.size_ = -1;
      local_118.text_ = (char *)0x0;
      local_118.size_ = -1;
      local_148.text_ = (char *)0x0;
      local_148.size_ = -1;
      local_178.text_ = (char *)0x0;
      local_178.size_ = -1;
      local_1a8.text_ = (char *)0x0;
      local_1a8.size_ = -1;
      strings::Substitute_abi_cxx11_
                (__return_storage_ptr__,
                 (strings *)"com.google.protobuf.Internal.bytesDefaultValue(\"$0\")",local_230,
                 (SubstituteArg *)local_1d8,&local_58,&local_88,&local_b8,&local_e8,&local_118,
                 &local_148,&local_178,&local_1a8,in_stack_fffffffffffffdc8);
    }
    else {
      src = *(string **)(this + 0xa0);
      uVar2 = src->_M_string_length;
      bVar13 = uVar2 == 0;
      if (bVar13) {
LAB_00218365:
        if (bVar13) {
          CEscape((string *)local_1d8,src);
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)local_1d8,0,(char *)0x0,0x356813);
          psVar9 = puVar7 + 2;
          if ((size_type *)*puVar7 == psVar9) {
            local_230._16_8_ = *psVar9;
            local_230._24_8_ = puVar7[3];
            local_230._0_8_ = local_230 + 0x10;
          }
          else {
            local_230._16_8_ = *psVar9;
            local_230._0_8_ = (size_type *)*puVar7;
          }
          local_230._8_8_ = puVar7[1];
          *puVar7 = psVar9;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append(local_230);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          psVar9 = (size_type *)(plVar6 + 2);
          if ((size_type *)*plVar6 == psVar9) {
            lVar3 = plVar6[3];
            (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
            *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
            (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
          }
          __return_storage_ptr__->_M_string_length = plVar6[1];
          *plVar6 = (long)psVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) goto LAB_0021849c;
          goto LAB_002184a9;
        }
      }
      else {
        pcVar10 = (src->_M_dataplus)._M_p;
        if (-1 < *pcVar10) {
          uVar4 = 1;
          do {
            uVar12 = uVar4;
            if (uVar2 == uVar12) break;
            uVar4 = uVar12 + 1;
          } while (-1 < pcVar10[uVar12]);
          bVar13 = uVar2 <= uVar12;
          goto LAB_00218365;
        }
      }
      CEscape(&local_1f8,src);
      local_230._0_8_ = local_1f8._M_dataplus._M_p;
      local_230._8_4_ = (undefined4)local_1f8._M_string_length;
      local_1d8._0_8_ = (long *)0x0;
      local_1d8._8_4_ = -1;
      local_58.text_ = (char *)0x0;
      local_58.size_ = -1;
      local_88.text_ = (char *)0x0;
      local_88.size_ = -1;
      local_b8.text_ = (char *)0x0;
      local_b8.size_ = -1;
      local_e8.text_ = (char *)0x0;
      local_e8.size_ = -1;
      local_118.text_ = (char *)0x0;
      local_118.size_ = -1;
      local_148.text_ = (char *)0x0;
      local_148.size_ = -1;
      local_178.text_ = (char *)0x0;
      local_178.size_ = -1;
      local_1a8.text_ = (char *)0x0;
      local_1a8.size_ = -1;
      strings::Substitute_abi_cxx11_
                (__return_storage_ptr__,
                 (strings *)"com.google.protobuf.Internal.stringDefaultValue(\"$0\")",local_230,
                 (SubstituteArg *)local_1d8,&local_58,&local_88,&local_b8,&local_e8,&local_118,
                 &local_148,&local_178,&local_1a8,in_stack_fffffffffffffdc8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p == &local_1f8.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_002185a0;
  case 10:
    descriptor = FieldDescriptor::message_type((FieldDescriptor *)this);
    ClassNameResolver::GetClassName_abi_cxx11_
              ((string *)local_230,(ClassNameResolver *)CONCAT71(in_register_00000009,immutable),
               descriptor,SUB81(field,0));
    plVar6 = (long *)std::__cxx11::string::append((char *)local_230);
    break;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_230,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_helpers.cc"
               ,0x1df);
    other = internal::LogMessage::operator<<((LogMessage *)local_230,"Can\'t get here.");
    internal::LogFinisher::operator=((LogFinisher *)local_1d8,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_230);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar10 = "";
    pcVar11 = "";
LAB_0021822c:
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar11,pcVar10);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar9) {
    lVar3 = plVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
  }
  __return_storage_ptr__->_M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
LAB_002180ff:
  local_1f8.field_2._M_allocated_capacity = local_230._16_8_;
  local_1f8._M_dataplus._M_p = (pointer)local_230._0_8_;
  if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
LAB_002185a0:
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string DefaultValue(const FieldDescriptor* field, bool immutable,
                    ClassNameResolver* name_resolver) {
  // Switch on CppType since we need to know which default_value_* method
  // of FieldDescriptor to call.
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return SimpleItoa(field->default_value_int32());
    case FieldDescriptor::CPPTYPE_UINT32:
      // Need to print as a signed int since Java has no unsigned.
      return SimpleItoa(static_cast<int32>(field->default_value_uint32()));
    case FieldDescriptor::CPPTYPE_INT64:
      return SimpleItoa(field->default_value_int64()) + "L";
    case FieldDescriptor::CPPTYPE_UINT64:
      return SimpleItoa(static_cast<int64>(field->default_value_uint64())) +
             "L";
    case FieldDescriptor::CPPTYPE_DOUBLE: {
      double value = field->default_value_double();
      if (value == std::numeric_limits<double>::infinity()) {
        return "Double.POSITIVE_INFINITY";
      } else if (value == -std::numeric_limits<double>::infinity()) {
        return "Double.NEGATIVE_INFINITY";
      } else if (value != value) {
        return "Double.NaN";
      } else {
        return SimpleDtoa(value) + "D";
      }
    }
    case FieldDescriptor::CPPTYPE_FLOAT: {
      float value = field->default_value_float();
      if (value == std::numeric_limits<float>::infinity()) {
        return "Float.POSITIVE_INFINITY";
      } else if (value == -std::numeric_limits<float>::infinity()) {
        return "Float.NEGATIVE_INFINITY";
      } else if (value != value) {
        return "Float.NaN";
      } else {
        return SimpleFtoa(value) + "F";
      }
    }
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "true" : "false";
    case FieldDescriptor::CPPTYPE_STRING:
      if (GetType(field) == FieldDescriptor::TYPE_BYTES) {
        if (field->has_default_value()) {
          // See comments in Internal.java for gory details.
          return strings::Substitute(
            "com.google.protobuf.Internal.bytesDefaultValue(\"$0\")",
            CEscape(field->default_value_string()));
        } else {
          return "com.google.protobuf.ByteString.EMPTY";
        }
      } else {
        if (AllAscii(field->default_value_string())) {
          // All chars are ASCII.  In this case CEscape() works fine.
          return "\"" + CEscape(field->default_value_string()) + "\"";
        } else {
          // See comments in Internal.java for gory details.
          return strings::Substitute(
              "com.google.protobuf.Internal.stringDefaultValue(\"$0\")",
              CEscape(field->default_value_string()));
        }
      }

    case FieldDescriptor::CPPTYPE_ENUM:
      return name_resolver->GetClassName(field->enum_type(), immutable) + "." +
          field->default_value_enum()->name();

    case FieldDescriptor::CPPTYPE_MESSAGE:
      return name_resolver->GetClassName(field->message_type(), immutable) +
          ".getDefaultInstance()";

    // No default because we want the compiler to complain if any new
    // types are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return "";
}